

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaInputFile::RgbaInputFile(RgbaInputFile *this,int partNumber,char *name,int numThreads)

{
  RgbaChannels rgbaChannels;
  MultiPartInputFile *this_00;
  InputPart *this_01;
  FromYca *this_02;
  
  this->_vptr_RgbaInputFile = (_func_int **)&PTR__RgbaInputFile_001e3fc0;
  this_00 = (MultiPartInputFile *)operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile(this_00,name,numThreads,true);
  this->_multiPartFile = this_00;
  this->_inputPart = (InputPart *)0x0;
  this->_fromYca = (FromYca *)0x0;
  (this->_channelNamePrefix)._M_dataplus._M_p = (pointer)&(this->_channelNamePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_channelNamePrefix,"");
  this_01 = (InputPart *)operator_new(8);
  InputPart::InputPart(this_01,this->_multiPartFile,partNumber);
  this->_inputPart = this_01;
  rgbaChannels = channels(this);
  if ((WRITE_YA|WRITE_RGB) < rgbaChannels) {
    this_02 = (FromYca *)operator_new(0x188);
    FromYca::FromYca(this_02,this->_inputPart,rgbaChannels);
    this->_fromYca = this_02;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (int partNumber, const char name[], int numThreads)
    : _multiPartFile (new MultiPartInputFile (name, numThreads))
    , _inputPart (nullptr)
    , _fromYca (nullptr)
    , _channelNamePrefix ("")
{
    try
    {
        _inputPart                = new InputPart (*_multiPartFile, partNumber);
        RgbaChannels rgbaChannels = channels ();
        if (rgbaChannels & WRITE_C)
            _fromYca = new FromYca (*_inputPart, rgbaChannels);
    }
    catch (...)
    {
        if (_inputPart) { delete _inputPart; }
        delete _multiPartFile;
        throw;
    }
}